

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>>::
emplace<QModelIndex,unsigned_int_const&>
          (QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,qsizetype i,
          QModelIndex *args,uint *args_1)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  pair<QPersistentModelIndex,_unsigned_int> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QPersistentModelIndex,_unsigned_int> tmp;
  pair<QPersistentModelIndex,_unsigned_int> *in_stack_ffffffffffffff68;
  Inserter *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff8c;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                     in_stack_ffffffffffffff70);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar3 != 0)) {
      QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::end
                ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                 in_stack_ffffffffffffff70);
      std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
                ((pair<QPersistentModelIndex,_unsigned_int> *)in_RDI,
                 (QModelIndex *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 (uint *)in_stack_ffffffffffffff70);
      in_RDI->displaceTo =
           (pair<QPersistentModelIndex,_unsigned_int> *)((long)&(in_RDI->displaceTo->first).d + 1);
      goto LAB_008398a6;
    }
    if ((in_RSI == (pair<QPersistentModelIndex,_unsigned_int> *)0x0) &&
       (qVar3 = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar3 != 0)) {
      QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin
                ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x839724);
      std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
                ((pair<QPersistentModelIndex,_unsigned_int> *)in_RDI,
                 (QModelIndex *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 (uint *)in_stack_ffffffffffffff70);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (pair<QPersistentModelIndex,_unsigned_int> *)((long)&(in_RDI->displaceTo->first).d + 1);
      goto LAB_008398a6;
    }
  }
  std::pair<QPersistentModelIndex,_unsigned_int>::pair<QModelIndex,_true>
            ((pair<QPersistentModelIndex,_unsigned_int> *)in_RDI,
             (QModelIndex *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (uint *)in_stack_ffffffffffffff70);
  bVar2 = in_RDI->displaceTo != (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
  uVar4 = bVar2 && in_RSI == (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::detachAndGrow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(qsizetype)in_RDI,
             (pair<QPersistentModelIndex,_unsigned_int> **)CONCAT17(uVar4,in_stack_ffffffffffffff78)
             ,(QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
              in_stack_ffffffffffffff70);
  if (bVar2 && in_RSI == (pair<QPersistentModelIndex,_unsigned_int> *)0x0) {
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x8397f6);
    std::pair<QPersistentModelIndex,_unsigned_int>::pair
              ((pair<QPersistentModelIndex,_unsigned_int> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo =
         (pair<QPersistentModelIndex,_unsigned_int> *)((long)&(in_RDI->displaceTo->first).d + 1);
  }
  else {
    QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::Inserter
              (in_RDI,(QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                      CONCAT17(uVar4,in_stack_ffffffffffffff78),(qsizetype)in_stack_ffffffffffffff70
               ,(qsizetype)in_stack_ffffffffffffff68);
    QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::insertOne
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::~Inserter(in_RDI);
  }
  std::pair<QPersistentModelIndex,_unsigned_int>::~pair
            ((pair<QPersistentModelIndex,_unsigned_int> *)0x8398a6);
LAB_008398a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }